

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

void rtmidi_open_virtual_port(RtMidiPtr device,char *portName)

{
  string name;
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,portName,&local_31);
  (**(code **)(*device->ptr + 8))(device->ptr,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void rtmidi_open_virtual_port (RtMidiPtr device, const char *portName)
{
    std::string name = portName;
    try {
        ((RtMidi*) device->ptr)->openVirtualPort (name);

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
    }

}